

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  char cVar1;
  char *__s;
  ushort *puVar2;
  char *__s_00;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  ushort **ppuVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  char syntax [200];
  char *in_stack_fffffffffffffee8;
  uint local_f8;
  undefined1 local_f4;
  
  pbVar10 = (byte *)*argtable;
  if ((*pbVar10 & 1) == 0) {
    lVar7 = 0;
    do {
      if (*(long *)(pbVar10 + 0x20) != 0) {
        memset(&local_f8,0,200);
        if (*(char **)(pbVar10 + 0x10) != (char *)0x0 && *(size_t *)(pbVar10 + 8) == 0) {
          local_f8 = 0x20202020;
          local_f4 = 0;
        }
        __s = *(char **)(pbVar10 + 0x20);
        arg_cat_optionv((char *)&local_f8,*(size_t *)(pbVar10 + 8),*(char **)(pbVar10 + 0x10),
                        *(char **)(pbVar10 + 0x18),(char *)(ulong)(*pbVar10 & 4),0x1127c6,
                        in_stack_fffffffffffffee8);
        sVar4 = strlen((char *)&local_f8);
        if (0x19 < sVar4) {
          arg_dstr_catf(ds,"  %-25s %s\n",&local_f8,"");
          local_f8 = local_f8 & 0xffffff00;
        }
        arg_dstr_catf(ds,"  %-25s ",&local_f8);
        pcVar5 = (char *)strlen(__s);
        if ((char *)0xfffffffe < pcVar5) {
          __assert_fail("strlen(text) < UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                        ,0x16c5,
                        "void arg_print_formatted_ds(arg_dstr_t, const unsigned int, const unsigned int, const char *)"
                       );
        }
        if ((int)pcVar5 != 0) {
          uVar13 = 0;
          ppuVar6 = __ctype_b_loc();
          uVar11 = (ulong)pcVar5 & 0xffffffff;
          do {
            puVar2 = *ppuVar6;
            uVar13 = (ulong)((int)uVar13 - 1);
            do {
              iVar9 = (int)uVar13;
              uVar12 = iVar9 + 1;
              uVar13 = (ulong)uVar12;
              cVar1 = __s[uVar13];
              if ((long)cVar1 == 10) break;
            } while ((puVar2[cVar1] & 0x2000) != 0);
            if (0x34 < (int)uVar11 - uVar12) {
              uVar11 = (ulong)(iVar9 + 0x35U);
              uVar8 = iVar9 + 0x35;
              uVar3 = iVar9 + 0x35U;
              if (uVar12 < 0xffffffcc) {
                do {
                  uVar8 = uVar3;
                  if ((*(byte *)((long)puVar2 + (long)__s[uVar8] * 2 + 1) & 0x20) != 0) break;
                  uVar8 = uVar8 - 1;
                  uVar3 = uVar8;
                } while (uVar12 < uVar8);
              }
              uVar3 = uVar8;
              if (uVar8 != uVar12) {
                while (((uVar12 < uVar3 && (uVar8 = uVar3, cVar1 != '\n')) &&
                       ((puVar2[__s[uVar3]] & 0x2000) != 0))) {
                  uVar8 = uVar12;
                  uVar3 = uVar3 - 1;
                }
                uVar11 = (ulong)(uVar8 + 1);
              }
            }
            do {
              if ((uint)uVar11 <= (uint)uVar13) break;
              cVar1 = __s[uVar13];
              if (cVar1 != '\n') {
                setup_append_buf(ds,2);
                __s_00 = ds->data;
                sVar4 = strlen(__s_00);
                __s_00[sVar4] = cVar1;
              }
              uVar13 = (ulong)((uint)uVar13 + 1);
            } while (cVar1 != '\n');
            arg_dstr_cat(ds,"\n");
            if ((uint)uVar11 < (uint)pcVar5) {
              iVar9 = 0x1c;
              do {
                arg_dstr_cat(ds," ");
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
              uVar11 = (ulong)pcVar5 & 0xffffffff;
            }
            in_stack_fffffffffffffee8 = pcVar5;
          } while ((uint)uVar13 < (uint)uVar11);
        }
      }
      pbVar10 = (byte *)argtable[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while ((*pbVar10 & 1) == 0);
  }
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}